

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.hpp
# Opt level: O3

uint64_t time_utils::parse_datetime_json(char *s)

{
  char cVar1;
  uint extraout_EAX;
  long lVar2;
  int *piVar3;
  system_error *this;
  error_category *__ecat;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *__what;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int aiStack_58 [14];
  
  uVar4 = 0;
  uVar5 = 0;
  cVar1 = *s;
  pcVar8 = s + 1;
  while (cVar1 != '-') {
    uVar6 = (int)cVar1 - 0x3a;
    __what = (char *)(ulong)uVar6;
    if ((byte)uVar6 < 0xf6) {
      parse_datetime_json();
      goto LAB_001031b8;
    }
    uVar5 = ((int)cVar1 + uVar5 * 10) - 0x30;
    cVar1 = *pcVar8;
    pcVar8 = pcVar8 + 1;
  }
  cVar1 = *pcVar8;
  pcVar8 = pcVar8 + 1;
  if (cVar1 != '-') {
    uVar4 = 0;
    do {
      uVar6 = (int)cVar1 - 0x3a;
      __what = (char *)(ulong)uVar6;
      if ((byte)uVar6 < 0xf6) goto LAB_001031b8;
      uVar4 = ((int)cVar1 + uVar4 * 10) - 0x30;
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 != '-');
  }
  cVar1 = *pcVar8;
  pcVar8 = pcVar8 + 1;
  __what = (char *)0xffffffff;
  if (cVar1 != 'T') {
    __what = (char *)0x0;
    do {
      if ((byte)(cVar1 - 0x3aU) < 0xf6) goto LAB_001031bf;
      iVar7 = (int)cVar1 + (int)__what * 10;
      __what = (char *)(ulong)(iVar7 - 0x30);
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 != 'T');
    __what = (char *)(ulong)(iVar7 - 0x31);
  }
  cVar1 = *pcVar8;
  pcVar8 = pcVar8 + 1;
  uVar10 = 0;
  if (cVar1 != ':') {
    do {
      if ((byte)(cVar1 - 0x3aU) < 0xf6) goto LAB_001031c6;
      uVar6 = ((int)cVar1 + (int)uVar10 * 10) - 0x30;
      uVar10 = (ulong)uVar6;
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 != ':');
    uVar10 = (ulong)uVar6;
  }
  cVar1 = *pcVar8;
  pcVar8 = pcVar8 + 1;
  uVar11 = 0;
  if (cVar1 != ':') {
    do {
      if ((byte)(cVar1 - 0x3aU) < 0xf6) goto LAB_001031cd;
      uVar6 = ((int)cVar1 + (int)uVar11 * 10) - 0x30;
      uVar11 = (ulong)uVar6;
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 != ':');
    uVar11 = (ulong)uVar6;
  }
  cVar1 = *pcVar8;
  pcVar8 = pcVar8 + 1;
  uVar12 = 0;
  if (cVar1 != '.') {
    do {
      if ((byte)(cVar1 - 0x3aU) < 0xf6) goto LAB_001031d4;
      uVar6 = ((int)cVar1 + (int)uVar12 * 10) - 0x30;
      uVar12 = (ulong)uVar6;
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 != '.');
    uVar12 = (ulong)uVar6;
  }
  cVar1 = *pcVar8;
  uVar13 = 0;
  if (cVar1 != 'Z') {
    do {
      pcVar8 = pcVar8 + 1;
      uVar6 = (uint)cVar1;
      if ((byte)(cVar1 - 0x3aU) < 0xf6) goto LAB_001031db;
      uVar6 = (uVar6 + (int)uVar13 * 10) - 0x30;
      uVar13 = (ulong)uVar6;
      cVar1 = *pcVar8;
    } while (cVar1 != 'Z');
    uVar13 = (ulong)uVar6;
  }
  if (uVar5 < 0x7d1) {
    lVar2 = 0;
  }
  else {
    uVar9 = 2000;
    iVar7 = -2000;
    lVar2 = 0;
    do {
      lVar14 = 0x16d;
      if ((uVar9 & 3) == 0) {
        lVar14 = (ulong)((int)(uVar9 / 400) * 400 + iVar7 == 0 ||
                        (int)(uVar9 / 100) * 100 + iVar7 != 0) + 0x16d;
      }
      lVar2 = lVar2 + lVar14;
      uVar6 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar6;
      iVar7 = iVar7 + -1;
    } while (uVar5 != uVar6);
  }
  aiStack_58[1] = 0x1f;
  aiStack_58[2] = 0x1c;
  if ((uVar5 & 3) == 0) {
    aiStack_58[2] =
         ((uVar5 * -0x3d70a3d7 >> 4 | uVar5 * -0x70000000) < 0xa3d70b ||
         0x28f5c28 < (uVar5 * -0x3d70a3d7 >> 2 | uVar5 * 0x40000000)) | 0x1c;
  }
  aiStack_58[3] = 0x1f;
  aiStack_58[4] = 0x1e;
  aiStack_58[5] = 0x1f;
  aiStack_58[6] = 0x1e;
  aiStack_58[7] = 0x1f;
  aiStack_58[8] = 0x1f;
  aiStack_58[9] = 0x1e;
  aiStack_58[10] = 0x1f;
  aiStack_58[0xb] = 0x1e;
  aiStack_58[0xc] = 0x1f;
  lVar14 = 0;
  if (1 < uVar4) {
    uVar9 = 1;
    do {
      lVar14 = (long)(int)lVar14 + (long)aiStack_58[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar4 != uVar9);
  }
  return (((uVar10 + (long)(__what + lVar14 + lVar2) * 0x18) * 0x3c + uVar11) * 0x3c + uVar12) *
         1000000000 + uVar13;
LAB_001031b8:
  parse_datetime_json();
LAB_001031bf:
  parse_datetime_json();
LAB_001031c6:
  parse_datetime_json();
LAB_001031cd:
  parse_datetime_json();
LAB_001031d4:
  parse_datetime_json();
  uVar6 = extraout_EAX;
LAB_001031db:
  parse_datetime_json();
  if ((int)uVar6 < 0) {
    piVar3 = __errno_location();
    iVar7 = *piVar3;
    this = (system_error *)__cxa_allocate_exception(0x20);
    __ecat = (error_category *)std::_V2::generic_category();
    std::system_error::system_error(this,iVar7,__ecat,__what);
    __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return (ulong)uVar6;
}

Assistant:

static inline
unsigned slurp_digits(const char *&s, char until)
{
    unsigned r = 0;
    while (true) {
        const char c = *s;
        ++s;
        if (c == until)
            break;
        const int digit = static_cast<int>(c) - '0';
        if (digit < 0 || digit > 9) {
            fprintf(stderr, "Symbol: %c (until '%c')\n", c, until);
            throw InvalidDateTime{};
        }
        r = r * 10 + digit;
    }
    return r;
}